

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O2

void replace_refs_in_line
               (string *line,string *pattern_in,string *pattern_out,label_idx_map *labels,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *refs,size_t line_no,bool ignore_comments)

{
  pointer pbVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  pointer pbVar9;
  string local_90;
  string new_ref;
  string ref;
  
  if (ignore_comments) {
    uVar3 = std::__cxx11::string::find((char)line,0x25);
  }
  else {
    uVar3 = line->_M_string_length;
  }
  pbVar9 = (refs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (refs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar9 == pbVar1) {
      return;
    }
    while ((uVar4 = std::__cxx11::string::find((string *)line,(ulong)pbVar9),
           uVar4 != 0xffffffffffffffff && (uVar4 <= uVar3))) {
      lVar5 = std::__cxx11::string::find((char)line,0x7d);
      if (lVar5 == -1) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"PARSING ERROR: No matching \'}\'");
        poVar8 = std::operator<<(poVar8," on line ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,line_no);
        std::operator<<(poVar8,'\n');
        exit(1);
      }
      uVar4 = uVar4 + pbVar9->_M_string_length;
      std::__cxx11::string::substr((ulong)&ref,(ulong)line);
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&labels->_M_t,&ref);
      if ((_Rb_tree_header *)cVar6._M_node == &(labels->_M_t)._M_impl.super__Rb_tree_header) {
        iVar2 = std::__cxx11::string::compare((ulong)&ref,0,(string *)pattern_in->_M_string_length);
        if (iVar2 == 0) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"PARSING WARNING: Undefined ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          poVar8 = std::operator<<(poVar8,(string *)&ref);
          poVar8 = std::operator<<(poVar8,"} on line ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::operator<<(poVar8,'\n');
        }
      }
      else {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::at(labels,&ref);
        std::__cxx11::to_string(&local_90,*pmVar7);
        std::operator+(&new_ref,pattern_out,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::replace((ulong)line,uVar4,(string *)(lVar5 - uVar4));
        std::__cxx11::string::~string((string *)&new_ref);
      }
      std::__cxx11::string::~string((string *)&ref);
    }
    pbVar9 = pbVar9 + 1;
  } while( true );
}

Assistant:

void replace_refs_in_line(std::string& line, const std::string& pattern_in,
                          const std::string& pattern_out,
                          const label_idx_map& labels,
                          const std::vector<std::string>& refs,
                          std::size_t line_no, bool ignore_comments) {
    std::size_t pos_comment = ignore_comments ? line.find('%') : line.size();
    // for all reference types
    for (auto&& elem : refs) {
        std::string::size_type start;
        std::string::size_type end = 0;
        while (true) {
            start = line.find(elem, end);
            if (start == std::string::npos || start > pos_comment) {
                break;
            }
            end = line.find('}', start);
            if (end == std::string::npos) {
                std::cerr << "PARSING ERROR: No matching '}'" << " on line "
                          << line_no << '\n';
                std::exit(EXIT_FAILURE);
            }

            auto start_replace = start + elem.size();
            auto count = end - (start + elem.size());
            std::string ref = line.substr(start_replace, count);
            auto found = labels.find(ref);
            if (found != labels.end()) {
                // construct the new reference
                std::string new_ref =
                    pattern_out + std::to_string(labels.at(ref));
                line.replace(start_replace, count, new_ref);
            }
            // the reference starts with pattern_in but it is not in the labels
            // map
            else if (ref.compare(0, pattern_in.size(), pattern_in) == 0) {
                std::cerr << "PARSING WARNING: Undefined " << elem << ref
                          << "} on line " << line_no << '\n';
            }
        }
    }
}